

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_z.cpp
# Opt level: O0

void zrotg(complex<double> *ca,complex<double> cb,double *c,complex<double> *s)

{
  double *pdVar1;
  double *pdVar2;
  complex<double> *pcVar3;
  undefined8 uVar4;
  complex<double> *in_XMM0_Qa;
  double dVar5;
  double dVar6;
  double __x;
  __type _Var7;
  __type _Var8;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 in_XMM1_Qa;
  undefined8 uVar9;
  complex<double> z;
  complex<double> z_00;
  complex<double> z_01;
  complex<double> z_02;
  complex<double> z_03;
  complex<double> z_04;
  complex<double> z_05;
  complex<double> local_118;
  complex<double> local_108 [2];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  double local_c8 [4];
  double local_a8;
  double local_98;
  complex<double> *local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  complex<double> local_70;
  undefined8 local_60;
  undefined8 local_58;
  double local_50;
  double scale;
  double norm;
  complex<double> alpha;
  complex<double> *s_local;
  double *c_local;
  complex<double> *ca_local;
  complex<double> cb_local;
  
  alpha._M_value._8_8_ = cb._M_value._8_8_;
  pdVar1 = cb._M_value._0_8_;
  pcVar3 = (complex<double> *)&norm;
  pdVar2 = pdVar1;
  ca_local = in_XMM0_Qa;
  cb_local._M_value._0_8_ = in_XMM1_Qa;
  std::complex<double>::complex(pcVar3,0.0,0.0);
  local_60 = *(undefined8 *)ca->_M_value;
  local_58 = *(undefined8 *)(ca->_M_value + 8);
  z._M_value._8_8_ = pdVar2;
  z._M_value._0_8_ = pcVar3;
  dVar5 = zabs2(z);
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    local_80 = *(undefined8 *)ca->_M_value;
    local_78 = *(undefined8 *)(ca->_M_value + 8);
    z_00._M_value._8_8_ = pdVar2;
    z_00._M_value._0_8_ = pcVar3;
    dVar6 = zabs2(z_00);
    local_90 = ca_local;
    local_88 = cb_local._M_value._0_8_;
    z_01._M_value._8_8_ = pdVar2;
    z_01._M_value._0_8_ = pcVar3;
    dVar5 = zabs2(z_01);
    dVar6 = dVar6 + dVar5;
    pdVar2 = &local_50;
    pcVar3 = ca;
    local_50 = dVar6;
    std::operator/(ca,pdVar2);
    z_02._M_value._8_8_ = pdVar2;
    z_02._M_value._0_8_ = pcVar3;
    local_98 = dVar5;
    __x = zabs2(z_02);
    _Var7 = std::pow<double,int>(__x,2);
    pcVar3 = (complex<double> *)&ca_local;
    pdVar2 = &local_50;
    std::operator/(pcVar3,pdVar2);
    z_03._M_value._8_8_ = pdVar2;
    z_03._M_value._0_8_ = pcVar3;
    local_a8 = dVar5;
    dVar5 = zabs2(z_03);
    uVar4 = 2;
    _Var8 = std::pow<double,int>(dVar5,2);
    dVar5 = sqrt(_Var7 + _Var8);
    scale = dVar6 * dVar5;
    local_d8 = *(undefined8 *)ca->_M_value;
    uVar9 = *(undefined8 *)(ca->_M_value + 8);
    z_04._M_value._8_8_ = pdVar2;
    z_04._M_value._0_8_ = uVar4;
    local_d0 = uVar9;
    local_c8[0] = zabs2(z_04);
    pdVar2 = local_c8;
    pcVar3 = ca;
    std::operator/(ca,pdVar2);
    local_e8 = *(undefined8 *)ca->_M_value;
    uVar4 = *(undefined8 *)(ca->_M_value + 8);
    z_05._M_value._8_8_ = pdVar2;
    z_05._M_value._0_8_ = pcVar3;
    local_e0 = uVar4;
    local_c8[2] = (double)uVar9;
    alpha._M_value._0_8_ = uVar9;
    dVar5 = zabs2(z_05);
    *pdVar1 = dVar5 / scale;
    std::conj<double>((complex<double> *)&ca_local);
    local_118._M_value._8_8_ = uVar4;
    std::operator*((complex<double> *)&norm,&local_118);
    local_108[0]._M_value._8_8_ = uVar4;
    std::operator/(local_108,&scale);
    *(undefined8 *)alpha._M_value._8_8_ = extraout_XMM0_Qa;
    *(undefined8 *)(alpha._M_value._8_8_ + 8) = uVar4;
    local_108[1]._M_value._8_8_ = uVar4;
    std::operator*((complex<double> *)&norm,&scale);
    *(undefined8 *)ca->_M_value = extraout_XMM0_Qa_00;
    *(undefined8 *)(ca->_M_value + 8) = uVar4;
  }
  else {
    *pdVar1 = 0.0;
    std::complex<double>::complex(&local_70,1.0,0.0);
    *(undefined8 *)alpha._M_value._8_8_ = local_70._M_value._0_8_;
    *(undefined8 *)(alpha._M_value._8_8_ + 8) = local_70._M_value._8_8_;
    *(complex<double> **)ca->_M_value = ca_local;
    *(undefined8 *)(ca->_M_value + 8) = cb_local._M_value._0_8_;
  }
  return;
}

Assistant:

void zrotg ( complex <double> *ca, complex <double> cb, double *c,
  complex <double> *s )

//****************************************************************************80
//
//  Purpose:
//
//    ZROTG determines a complex <double> Givens rotation.
//
//  Discussion:
//
//    This routine uses double precision complex arithmetic.
//
//    Given values A and B, this routine computes:
//
//    If A = 0:
//
//      R = B
//      C = 0
//      S = (1,0).
//
//    If A /= 0:
//
//      ALPHA = A / abs ( A )
//      NORM  = sqrt ( ( abs ( A ) )^2 + ( abs ( B ) )^2 )
//      R     = ALPHA * NORM
//      C     = abs ( A ) / NORM
//      S     = ALPHA * conj ( B ) / NORM
//
//    In either case, the computed numbers satisfy the equation:
//
//    (         C    S ) * ( A ) = ( R )
//    ( -conj ( S )  C )   ( B ) = ( 0 )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    31 March 2007
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for FORTRAN usage,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, pages 308-323, 1979.
//
//  Parameters:
//
//    Input/output, complex <double> *CA, on input, the value A.  On output,
//    the value R.
//
//    Input, complex <double> CB, the value B.
//
//    Output, double *C, the cosine of the Givens rotation.
//
//    Output, complex <double> *S, the sine of the Givens rotation.
//
{
  complex <double> alpha;
  double norm;
  double scale;

  if ( zabs2 ( *ca ) == 0.0 )
  {
    *c = 0.0;
    *s = complex <double> ( 1.0, 0.0 );
    *ca = cb;
  }
  else
  {
    scale = zabs2 ( *ca ) + zabs2 ( cb );
    norm = scale * sqrt ( pow ( zabs2 ( *ca / scale ), 2 )
                        + pow ( zabs2 (  cb / scale ), 2 ) );
    alpha = *ca / zabs2 ( *ca );
    *c = zabs2 ( *ca ) / norm;
    *s = alpha * conj ( cb ) / norm;
    *ca = alpha * norm;
  }

  return;
}